

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dutil.c
# Opt level: O2

void dinf_norm_error(int nrhs,SuperMatrix *X,double *xtrue)

{
  double dVar1;
  int *piVar2;
  long lVar3;
  undefined1 auVar4 [16];
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  undefined1 auVar8 [16];
  
  piVar2 = (int *)X->Store;
  if (nrhs < 1) {
    nrhs = 0;
  }
  lVar3 = *(long *)(piVar2 + 2);
  for (iVar7 = 0; iVar7 != nrhs; iVar7 = iVar7 + 1) {
    uVar5 = (ulong)(uint)X->nrow;
    if (X->nrow < 1) {
      uVar5 = 0;
    }
    auVar8 = ZEXT816(0);
    for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
      dVar1 = *(double *)((long)(*piVar2 * iVar7) * 8 + lVar3 + uVar6 * 8);
      auVar4._8_8_ = ABS(dVar1 - xtrue[uVar6]);
      auVar4._0_8_ = ABS(dVar1);
      auVar8 = maxpd(auVar8,auVar4);
    }
    printf("||X - Xtrue||/||X|| = %e\n",auVar8._8_8_ / auVar8._0_8_);
  }
  return;
}

Assistant:

void dinf_norm_error(int nrhs, SuperMatrix *X, double *xtrue)
{
    DNformat *Xstore;
    double err, xnorm;
    double *Xmat, *soln_work;
    int i, j;

    Xstore = X->Store;
    Xmat = Xstore->nzval;

    for (j = 0; j < nrhs; j++) {
      soln_work = &Xmat[j*Xstore->lda];
      err = xnorm = 0.0;
      for (i = 0; i < X->nrow; i++) {
	err = SUPERLU_MAX(err, fabs(soln_work[i] - xtrue[i]));
	xnorm = SUPERLU_MAX(xnorm, fabs(soln_work[i]));
      }
      err = err / xnorm;
      printf("||X - Xtrue||/||X|| = %e\n", err);
    }
}